

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

void __thiscall soplex::SPxSteepPR<double>::left4(SPxSteepPR<double> *this,int n,SPxId id)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  SPxBasisBase<double> *this_00;
  double *pdVar5;
  double *pdVar6;
  UpdateVector<double> *pUVar7;
  double *pdVar8;
  IdxSet *this_01;
  IdxSet *this_02;
  char *pcVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar10;
  int in_ESI;
  long in_RDI;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  int j;
  int i;
  int len;
  IdxSet *rhoIdx;
  double beta_q;
  double rhov_1;
  double *rhoVec;
  double *workVec_ptr;
  double *coWeights_ptr;
  double delta;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_58;
  SPxId local_8;
  
  bVar2 = SPxId::isValid(&local_8);
  if (bVar2) {
    this_00 = SPxSolverBase<double>::basis(*(SPxSolverBase<double> **)(in_RDI + 0x10));
    iVar3 = SPxBasisBase<double>::iteration(this_00);
    dVar11 = 1.0 / (double)iVar3 + 0.1;
    pdVar5 = VectorBase<double>::get_ptr((VectorBase<double> *)0x2ac53e);
    pdVar6 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2ac555);
    pUVar7 = SPxSolverBase<double>::fVec(*(SPxSolverBase<double> **)(in_RDI + 0x10));
    UpdateVector<double>::delta(pUVar7);
    pdVar8 = SSVectorBase<double>::values((SSVectorBase<double> *)0x2ac57b);
    dVar12 = 1.0 / pdVar8[in_ESI];
    pUVar7 = SPxSolverBase<double>::coPvec(*(SPxSolverBase<double> **)(in_RDI + 0x10));
    UpdateVector<double>::delta(pUVar7);
    dVar13 = SSVectorBase<double>::length2
                       ((SSVectorBase<double> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    dVar13 = dVar13 * dVar12 * dVar12;
    SPxSolverBase<double>::fVec(*(SPxSolverBase<double> **)(in_RDI + 0x10));
    this_01 = UpdateVector<double>::idx((UpdateVector<double> *)0x2ac5e6);
    SPxSolverBase<double>::fVec(*(SPxSolverBase<double> **)(in_RDI + 0x10));
    this_02 = UpdateVector<double>::idx((UpdateVector<double> *)0x2ac604);
    iVar3 = IdxSet::size(this_02);
    uVar10 = extraout_RDX;
    for (local_58 = 0; (int)local_58 < iVar3; local_58 = local_58 + 1) {
      pcVar9 = IdxSet::index(this_01,(char *)(ulong)local_58,(int)uVar10);
      iVar4 = (int)pcVar9;
      pdVar5[iVar4] =
           pdVar8[iVar4] * (dVar13 * pdVar8[iVar4] - dVar12 * 2.0 * pdVar6[iVar4]) + pdVar5[iVar4];
      if (dVar11 <= pdVar5[iVar4]) {
        dVar1 = pdVar5[iVar4];
        auVar14 = infinity();
        uVar10 = auVar14._8_8_;
        if (*auVar14._0_8_ <= dVar1) {
          pdVar5[iVar4] = 1.0 / *(double *)(in_RDI + 0x18);
        }
      }
      else {
        pdVar5[iVar4] = dVar11;
        uVar10 = extraout_RDX_00;
      }
    }
    pdVar5[in_ESI] = dVar13;
  }
  return;
}

Assistant:

void SPxSteepPR<R>::left4(int n, SPxId id)
{
   assert(this->thesolver->type() == SPxSolverBase<R>::LEAVE);

   if(id.isValid())
   {
      R        delta         = 0.1 + 1.0 / this->thesolver->basis().iteration();
      R*       coWeights_ptr = this->thesolver->coWeights.get_ptr();
      const R* workVec_ptr   = workVec.get_const_ptr();
      const R* rhoVec        = this->thesolver->fVec().delta().values();
      R        rhov_1        = 1.0 / rhoVec[n];
      R        beta_q        = this->thesolver->coPvec().delta().length2() * rhov_1 * rhov_1;

#ifndef NDEBUG

      if(spxAbs(rhoVec[n]) < this->thetolerance * 0.5)
      {
         SPX_MSG_INFO3((*this->thesolver->spxout), (*this->thesolver->spxout) << "WSTEEP04: rhoVec = "
                       << rhoVec[n] << " with smaller absolute value than 0.5*thetolerance = " << 0.5 * this->thetolerance
                       << std::endl;)
      }

#endif

      const IdxSet& rhoIdx = this->thesolver->fVec().idx();
      int           len    = this->thesolver->fVec().idx().size();

      for(int i = 0; i < len; ++i)
      {
         int  j = rhoIdx.index(i);
         coWeights_ptr[j] += rhoVec[j] * (beta_q * rhoVec[j] - 2.0 * rhov_1 * workVec_ptr[j]);

         if(coWeights_ptr[j] < delta)
            coWeights_ptr[j] = delta; // coWeights_ptr[j] = delta / (1+delta-x);
         else if(coWeights_ptr[j] >= R(infinity))
            coWeights_ptr[j] = 1.0 / this->thetolerance;
      }

      coWeights_ptr[n] = beta_q;
   }
}